

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

size_t Catch::listTests(Config *config)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  TestSpecParser *this;
  vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *testCases;
  ostream *poVar2;
  undefined4 extraout_var_01;
  pointer pcVar3;
  pointer _str;
  allocator local_141;
  Colour colourGuard;
  TextAttributes local_118;
  vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> matchedTestCases;
  TextAttributes local_e8;
  TestSpec testSpec;
  undefined1 local_b8 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_90;
  pointer local_80;
  pointer pbStack_78;
  pointer local_70;
  pointer pPStack_68;
  pointer local_60;
  pointer pPStack_58;
  pointer local_50;
  pointer pFStack_48;
  pointer local_40;
  ITagAliasRegistry *local_38;
  
  iVar1 = (*(config->super_SharedImpl<Catch::IConfig>).super_IConfig.super_IShared.super_NonCopyable
            ._vptr_NonCopyable[0xd])();
  std::vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>::vector
            (&testSpec.m_filters,
             (vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_> *)
             CONCAT44(extraout_var,iVar1));
  iVar1 = (*(config->super_SharedImpl<Catch::IConfig>).super_IConfig.super_IShared.super_NonCopyable
            ._vptr_NonCopyable[0xd])(config);
  if (*(long *)CONCAT44(extraout_var_00,iVar1) == ((long *)CONCAT44(extraout_var_00,iVar1))[1]) {
    std::operator<<((ostream *)&std::cout,"All available test cases:\n");
    local_38 = ITagAliasRegistry::get();
    local_a0._M_allocated_capacity = (size_type)&local_90;
    local_a0._8_8_ = 0;
    local_90._M_local_buf[0] = '\0';
    local_80 = (pointer)0x0;
    pbStack_78 = (pointer)0x0;
    local_70 = (pointer)0x0;
    pPStack_68 = (pointer)0x0;
    local_60 = (pointer)0x0;
    pPStack_58 = (pointer)0x0;
    local_50 = (pointer)0x0;
    pFStack_48 = (pointer)0x0;
    local_40 = (pointer)0x0;
    std::__cxx11::string::string((string *)&colourGuard,"*",(allocator *)&local_e8);
    this = TestSpecParser::parse((TestSpecParser *)local_b8,(string *)&colourGuard);
    TestSpecParser::testSpec((TestSpec *)&local_118,this);
    std::vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>::_M_move_assign
              (&testSpec.m_filters,&local_118);
    std::vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>::~vector
              ((vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_> *)
               &local_118);
    std::__cxx11::string::~string((string *)&colourGuard);
    TestSpecParser::~TestSpecParser((TestSpecParser *)local_b8);
  }
  else {
    std::operator<<((ostream *)&std::cout,"Matching test cases:\n");
  }
  local_118.width = 0x4f;
  local_e8.initialIndent = 0xffffffffffffffff;
  local_e8.width = 0x4f;
  local_118.initialIndent = 2;
  local_118.indent = 4;
  local_e8.indent = 6;
  testCases = getAllTestCasesSorted((IConfig *)config);
  filterTests(&matchedTestCases,testCases,&testSpec,(IConfig *)config);
  pcVar3 = (pointer)0x0;
  for (_str = matchedTestCases.super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>
              ._M_impl.super__Vector_impl_data._M_start;
      _str != matchedTestCases.super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>
              ._M_impl.super__Vector_impl_data._M_finish; _str = _str + 1) {
    colourGuard.m_moved = false;
    Colour::use((int)((_str->super_TestCaseInfo).properties << 0x1e) >> 0x1f & FileName);
    Tbc::Text::Text((Text *)local_b8,(string *)_str,&local_118);
    poVar2 = Tbc::operator<<((ostream *)&std::cout,(Text *)local_b8);
    std::endl<char,std::char_traits<char>>(poVar2);
    Tbc::Text::~Text((Text *)local_b8);
    if ((_str->super_TestCaseInfo).tags._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
      Tbc::Text::Text((Text *)local_b8,&(_str->super_TestCaseInfo).tagsAsString,&local_e8);
      poVar2 = Tbc::operator<<((ostream *)&std::cout,(Text *)local_b8);
      std::endl<char,std::char_traits<char>>(poVar2);
      Tbc::Text::~Text((Text *)local_b8);
    }
    Colour::~Colour(&colourGuard);
    pcVar3 = pcVar3 + 1;
  }
  iVar1 = (*(config->super_SharedImpl<Catch::IConfig>).super_IConfig.super_IShared.super_NonCopyable
            ._vptr_NonCopyable[0xd])();
  local_b8._0_8_ = pcVar3;
  if (*(long *)CONCAT44(extraout_var_01,iVar1) == ((long *)CONCAT44(extraout_var_01,iVar1))[1]) {
    std::__cxx11::string::string((string *)&colourGuard,"test case",&local_141);
    std::__cxx11::string::string((string *)(local_b8 + 8),(string *)&colourGuard);
    operator<<((ostream *)&std::cout,(pluralise *)local_b8);
    poVar2 = std::operator<<((ostream *)&std::cout,'\n');
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  else {
    std::__cxx11::string::string((string *)&colourGuard,"matching test case",&local_141);
    std::__cxx11::string::string((string *)(local_b8 + 8),(string *)&colourGuard);
    operator<<((ostream *)&std::cout,(pluralise *)local_b8);
    poVar2 = std::operator<<((ostream *)&std::cout,'\n');
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  std::__cxx11::string::~string((string *)(local_b8 + 8));
  std::__cxx11::string::~string((string *)&colourGuard);
  std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::~vector(&matchedTestCases);
  std::vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>::~vector
            (&testSpec.m_filters);
  return (size_t)pcVar3;
}

Assistant:

inline std::size_t listTests( Config const& config ) {

        TestSpec testSpec = config.testSpec();
        if( config.testSpec().hasFilters() )
            Catch::cout() << "Matching test cases:\n";
        else {
            Catch::cout() << "All available test cases:\n";
            testSpec = TestSpecParser( ITagAliasRegistry::get() ).parse( "*" ).testSpec();
        }

        std::size_t matchedTests = 0;
        TextAttributes nameAttr, tagsAttr;
        nameAttr.setInitialIndent( 2 ).setIndent( 4 );
        tagsAttr.setIndent( 6 );

        std::vector<TestCase> matchedTestCases = filterTests( getAllTestCasesSorted( config ), testSpec, config );
        for( std::vector<TestCase>::const_iterator it = matchedTestCases.begin(), itEnd = matchedTestCases.end();
                it != itEnd;
                ++it ) {
            matchedTests++;
            TestCaseInfo const& testCaseInfo = it->getTestCaseInfo();
            Colour::Code colour = testCaseInfo.isHidden()
                ? Colour::SecondaryText
                : Colour::None;
            Colour colourGuard( colour );

            Catch::cout() << Text( testCaseInfo.name, nameAttr ) << std::endl;
            if( !testCaseInfo.tags.empty() )
                Catch::cout() << Text( testCaseInfo.tagsAsString, tagsAttr ) << std::endl;
        }

        if( !config.testSpec().hasFilters() )
            Catch::cout() << pluralise( matchedTests, "test case" ) << '\n' << std::endl;
        else
            Catch::cout() << pluralise( matchedTests, "matching test case" ) << '\n' << std::endl;
        return matchedTests;
    }